

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O1

void __thiscall
bidirectional::BiDirectional::getMinimumWeights(BiDirectional *this,double *fwd_min,double *bwd_min)

{
  _Rb_tree_node_base *p_Var1;
  double dVar2;
  _Rb_tree_color _Var3;
  Search *pSVar4;
  double *pdVar5;
  _Rb_tree_node_base *p_Var6;
  
  *fwd_min = INFINITY;
  pSVar4 = (this->fwd_search_ptr_)._M_t.
           super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
           ._M_t.
           super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
           .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl;
  p_Var6 = *(_Base_ptr *)((long)&(pSVar4->visited_vertices)._M_t + 0x18);
  p_Var1 = (_Rb_tree_node_base *)((long)&(pSVar4->visited_vertices)._M_t + 8);
  if (p_Var6 != p_Var1) {
    _Var3 = (((this->graph_ptr_)._M_t.
              super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
              ._M_t.
              super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
              .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>._M_head_impl)->source).
            lemon_id;
    do {
      if (((p_Var6[1]._M_color != _Var3) &&
          (pdVar5 = *(double **)
                     (*(long *)&(pSVar4->best_labels).
                                super__Vector_base<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
                                ._M_impl + (long)(int)p_Var6[1]._M_color * 0x10),
          pdVar5 != (double *)0x0)) && (dVar2 = *pdVar5, dVar2 < *fwd_min)) {
        *fwd_min = dVar2;
      }
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != p_Var1);
  }
  *bwd_min = INFINITY;
  pSVar4 = (this->bwd_search_ptr_)._M_t.
           super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
           ._M_t.
           super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
           .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl;
  p_Var6 = *(_Base_ptr *)((long)&(pSVar4->visited_vertices)._M_t + 0x18);
  p_Var1 = (_Rb_tree_node_base *)((long)&(pSVar4->visited_vertices)._M_t + 8);
  if (p_Var6 != p_Var1) {
    _Var3 = (((this->graph_ptr_)._M_t.
              super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
              ._M_t.
              super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
              .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>._M_head_impl)->sink).lemon_id;
    do {
      if (((p_Var6[1]._M_color != _Var3) &&
          (pdVar5 = *(double **)
                     (*(long *)&(pSVar4->best_labels).
                                super__Vector_base<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
                                ._M_impl + (long)(int)p_Var6[1]._M_color * 0x10),
          pdVar5 != (double *)0x0)) && (dVar2 = *pdVar5, dVar2 < *bwd_min)) {
        *bwd_min = dVar2;
      }
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != p_Var1);
  }
  return;
}

Assistant:

void BiDirectional::getMinimumWeights(double* fwd_min, double* bwd_min) {
  // Forward
  // init
  *fwd_min = std::numeric_limits<double>::infinity();
  for (const int& n : fwd_search_ptr_->visited_vertices) {
    if (n != graph_ptr_->source.lemon_id && fwd_search_ptr_->best_labels[n] &&
        fwd_search_ptr_->best_labels[n]->weight < *fwd_min) {
      *fwd_min = fwd_search_ptr_->best_labels[n]->weight;
    }
  }
  // backward
  *bwd_min = std::numeric_limits<double>::infinity();
  for (const int& n : bwd_search_ptr_->visited_vertices) {
    if (n != graph_ptr_->sink.lemon_id && bwd_search_ptr_->best_labels[n] &&
        bwd_search_ptr_->best_labels[n]->weight < *bwd_min) {
      *bwd_min = bwd_search_ptr_->best_labels[n]->weight;
    }
  }
}